

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.c
# Opt level: O1

void next_screenshot(SCREENSHOT *ss)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  char buf [64];
  char acStack_58 [72];
  
  iVar2 = ss->counter;
  uVar1 = iVar2 + 1;
  ss->counter = uVar1;
  if (iVar2 < 9999) {
    snprintf(acStack_58,0x40,"%s%04d.%s",ss->name,(ulong)uVar1,ss->ext);
    cVar3 = al_filename_exists(acStack_58);
    if (cVar3 != '\0') {
      next_screenshot(ss);
    }
  }
  else {
    ss->counter = 0;
  }
  return;
}

Assistant:

static void next_screenshot(SCREENSHOT * ss)
{
   char buf[64];

   ss->counter++;
   if (ss->counter >= 10000) {
      ss->counter = 0;
      return;
   }

   snprintf(buf, sizeof(buf), "%s%04d.%s", ss->name, ss->counter, ss->ext);
   if (al_filename_exists(buf)) {
      next_screenshot(ss);
   }
}